

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O2

bool __thiscall OpenMD::RigidBody::getAtomPos(RigidBody *this,Vector3d *pos,uint index)

{
  ulong uVar1;
  ulong uVar2;
  Vector3d ref;
  Vector<double,_3U> VStack_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  uVar2 = (ulong)index;
  uVar1 = (long)(this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  if (uVar2 < uVar1) {
    StuntDouble::body2Lab
              ((Vector3d *)&local_48,&this->super_StuntDouble,
               (this->refCoords_).
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar2);
    StuntDouble::getPos((Vector3d *)&VStack_78,&this->super_StuntDouble);
    operator+(&local_60,&VStack_78,&local_48);
    Vector3<double>::operator=(pos,&local_60);
  }
  else {
    snprintf(painCave.errMsg,2000,
             "%d is an invalid index. The current rigid body contans %zu atoms.\n",(ulong)index,
             uVar1);
    painCave.isFatal = 0;
    simError();
  }
  return uVar2 < uVar1;
}

Assistant:

bool RigidBody::getAtomPos(Vector3d& pos, unsigned int index) {
    if (index < atoms_.size()) {
      Vector3d ref = body2Lab(refCoords_[index]);
      pos          = getPos() + ref;
      return true;
    } else {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "%d is an invalid index. The current rigid body contans %zu atoms.\n",
          index, atoms_.size());
      painCave.isFatal = 0;
      simError();
      return false;
    }
  }